

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSO.h
# Opt level: O0

void __thiscall PSO::printResult(PSO *this)

{
  ostream *poVar1;
  reference pvVar2;
  PSO *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"PSO Predicted Point : ");
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&(this->result).first,0);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  poVar1 = std::operator<<(poVar1," , ");
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&(this->result).first,1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Error : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->result).second);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

auto printResult() -> void
    {
        cout << "PSO Predicted Point : " << result.first[0] << " , " << result.first[1] << endl;
        cout << "Error : " << result.second << endl;
    }